

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_init_gnss_glo_const(fsnav_glo_const *glo_const)

{
  fsnav_glo_const *glo_const_local;
  
  glo_const->mu = 398600441800000.0;
  glo_const->J02 = 0.00108262575;
  glo_const->u = 7.292115e-05;
  glo_const->a = 6378136.0;
  glo_const->e2 = 0.0066943662;
  glo_const->F01 = 1602000000.0;
  glo_const->dF1 = 562500.0;
  glo_const->F02 = 1246000000.0;
  glo_const->dF2 = 437500.0;
  return;
}

Assistant:

void fsnav_init_gnss_glo_const(fsnav_glo_const* glo_const)
{
	glo_const->mu  = 398600.4418e9; // Earth gravity constant as in PZ-90.11 (2014), m^3/s^2
	glo_const->J02 = 1082.62575e-6; // second degree zonal harmonic coefficient of normal potential as in PZ-90.11 (2014)
	glo_const->u   = 7.292115e-5;   // Earth rotation rate as in PZ-90.11 (2014), rad/s
	glo_const->a   = 6378136.0;     // Earth ellipsoid semi-major axis as in PZ-90.11 (2014), m
	glo_const->e2  = 0.0066943662;  // Earth ellipsoid first eccentricity squared as in PZ-90.11 (2014)
	glo_const->F01 = 1602e6;        // nominal centre frequency for L1 signal as in ICD GLONASS Edition 5.1 2008, Hz
	glo_const->dF1 = 562.5e3;       // nominal channel separation for L1 signal as in ICD GLONASS Edition 5.1 2008, Hz
	glo_const->F02 = 1246e6;        // nominal centre frequency for L2 signal as in ICD GLONASS Edition 5.1 2008, Hz
	glo_const->dF2 = 437.5e3;       // nominal channel separation for L2 signal as in ICD GLONASS Edition 5.1 2008, Hz
}